

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int __thiscall
embree::QuadMesh::verify
          (QuadMesh *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fa> *pBVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  iterator __begin1;
  BufferView<embree::Vec3fa> *pBVar7;
  float *pfVar8;
  uint *puVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong in_R11;
  bool bVar13;
  
  sVar2 = (this->vertices).size_active;
  if (sVar2 != 0) {
    pBVar7 = (this->vertices).items;
    pBVar1 = pBVar7 + sVar2;
    uVar6 = sVar2 * 0x38 - 0x38;
    uVar11 = 0;
    do {
      uVar12 = uVar11;
      uVar11 = uVar12;
      if (uVar6 == uVar12) goto LAB_00a57930;
      uVar11 = uVar12 + 0x38;
    } while (*(size_t *)((long)&pBVar7[1].super_RawBufferView.num + uVar12) ==
             (pBVar7->super_RawBufferView).num);
    if (uVar6 == uVar12) {
LAB_00a57930:
      uVar6 = (ulong)(this->super_Geometry).numPrimitives;
      bVar13 = uVar6 != 0;
      if (bVar13) {
        puVar9 = *(uint **)&(this->super_Geometry).field_0x58;
        uVar11 = (pBVar7->super_RawBufferView).num;
        if (*puVar9 < uVar11) {
          puVar9 = puVar9 + 3;
          uVar12 = 1;
          do {
            in_R11 = (ulong)puVar9[-2];
            if (((uVar11 <= in_R11) || (in_R11 = (ulong)puVar9[-1], uVar11 <= in_R11)) ||
               (in_R11 = (ulong)*puVar9, uVar11 <= in_R11)) break;
            if (uVar6 == uVar12) goto LAB_00a57996;
            bVar13 = uVar12 < uVar6;
            in_R11 = (ulong)*(uint *)((long)puVar9 + *(long *)&this->field_0x68 + -0xc);
            puVar9 = (uint *)((long)puVar9 + *(long *)&this->field_0x68);
            uVar12 = uVar12 + 1;
          } while (in_R11 < uVar11);
        }
        if (bVar13) {
          return 0;
        }
      }
LAB_00a57996:
      uVar5 = 0;
      do {
        uVar6 = (pBVar7->super_RawBufferView).num;
        bVar13 = uVar6 != 0;
        if (bVar13) {
          pfVar8 = (float *)(pBVar7->super_RawBufferView).ptr_ofs;
          auVar3._4_4_ = -(uint)(pfVar8[1] < 1.844e+18 && -1.844e+18 < pfVar8[1]);
          auVar3._0_4_ = -(uint)(*pfVar8 < 1.844e+18 && -1.844e+18 < *pfVar8);
          auVar3._8_4_ = -(uint)(pfVar8[2] < 1.844e+18 && -1.844e+18 < pfVar8[2]);
          auVar3._12_4_ = -(uint)(pfVar8[3] < 1.844e+18 && -1.844e+18 < pfVar8[3]);
          uVar10 = movmskps((int)uVar11,auVar3);
          uVar11 = (ulong)CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10);
          if ((~(byte)uVar10 & 7) == 0) {
            uVar11 = uVar6 - 1;
            uVar12 = 0;
            do {
              pfVar8 = (float *)((long)pfVar8 + (pBVar7->super_RawBufferView).stride);
              if (uVar11 == uVar12) goto LAB_00a57a17;
              auVar4._4_4_ = -(uint)(pfVar8[1] < 1.844e+18 && -1.844e+18 < pfVar8[1]);
              auVar4._0_4_ = -(uint)(*pfVar8 < 1.844e+18 && -1.844e+18 < *pfVar8);
              auVar4._8_4_ = -(uint)(pfVar8[2] < 1.844e+18 && -1.844e+18 < pfVar8[2]);
              auVar4._12_4_ = -(uint)(pfVar8[3] < 1.844e+18 && -1.844e+18 < pfVar8[3]);
              uVar10 = movmskps((int)in_R11,auVar4);
              in_R11 = (ulong)CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10);
              uVar12 = uVar12 + 1;
            } while ((~(byte)uVar10 & 7) == 0);
            bVar13 = uVar12 < uVar6;
          }
          if (bVar13) {
            return uVar5;
          }
        }
LAB_00a57a17:
        pBVar7 = pBVar7 + 1;
        bVar13 = pBVar7 == pBVar1;
        uVar5 = (uint)bVar13;
        if (bVar13) {
          return (uint)bVar13;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }